

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_basetableref.cpp
# Opt level: O2

unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true> __thiscall
duckdb::Binder::BindWithReplacementScan(Binder *this,ClientContext *context,BaseTableRef *ref)

{
  pointer pRVar1;
  BindingMode BVar2;
  DBConfig *pDVar3;
  pointer pTVar4;
  TableFunctionRef *pTVar5;
  SubqueryRef *pSVar6;
  InternalException *this_00;
  __uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_> in_RCX;
  pointer pRVar7;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> this_01;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> this_02;
  undefined1 local_a0 [16];
  _Head_base<0UL,_duckdb::TableRef_*,_false> local_90;
  _Head_base<0UL,_duckdb::BoundTableRef_*,_false> local_88;
  string *local_80;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_78;
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_> local_70;
  ReplacementScanInput input;
  string local_50;
  
  pDVar3 = DBConfig::GetConfig((ClientContext *)ref);
  if (*(char *)((long)&ref[1].super_TableRef.alias._M_string_length + 4) != '\0') {
    pRVar1 = (pDVar3->replacement_scans).
             super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
             super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_80 = (string *)
               ((long)in_RCX._M_t.
                      super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>
                      .super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl + 0xa8);
    local_88._M_head_impl = (BoundTableRef *)this;
    local_78._M_head_impl = (RegisteredStateManager *)context;
    local_70._M_t.super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
    super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true,_true>)
         (__uniq_ptr_data<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true,_true>)
         in_RCX._M_t.super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
         super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
    for (pRVar7 = (pDVar3->replacement_scans).
                  super_vector<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>.
                  super__Vector_base<duckdb::ReplacementScan,_std::allocator<duckdb::ReplacementScan>_>
                  ._M_impl.super__Vector_impl_data._M_start; this = (Binder *)local_88,
        pRVar7 != pRVar1; pRVar7 = pRVar7 + 1) {
      input.table_name = local_80;
      input.catalog_name =
           (string *)
           ((long)in_RCX._M_t.
                  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
                  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl + 0x68);
      input.schema_name =
           (string *)
           ((long)in_RCX._M_t.
                  super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
                  super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl + 0x88);
      (*pRVar7->function)((ClientContext *)local_a0,(ReplacementScanInput *)ref,
                          (ReplacementScanData *)&input);
      if ((_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
          local_a0._0_8_ != (TableRef *)0x0) {
        if (*(long *)((long)local_70._M_t.
                            super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>
                            .super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl + 0x18) ==
            0) {
          pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                   operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                               *)local_a0);
          this_02._M_head_impl = local_78._M_head_impl;
          this_01._M_head_impl = local_88._M_head_impl;
          if ((pTVar4->alias)._M_string_length != 0) goto LAB_0161c5e1;
          pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                   operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                               *)local_a0);
        }
        else {
          pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                   operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                               *)local_a0);
          this_01._M_head_impl = local_88._M_head_impl;
          this_02._M_head_impl = local_78._M_head_impl;
        }
        ::std::__cxx11::string::_M_assign((string *)&pTVar4->alias);
LAB_0161c5e1:
        pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                 operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                             *)local_a0);
        if (pTVar4->type == TABLE_FUNCTION) {
          pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                   operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                               *)local_a0);
          pTVar5 = TableRef::Cast<duckdb::TableFunctionRef>(pTVar4);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&(pTVar5->super_TableRef).column_name_alias,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)local_70._M_t.
                                super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>
                                .super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl + 0x50)
                     );
        }
        else {
          pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                   operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                               *)local_a0);
          if (pTVar4->type != SUBQUERY) {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            ::std::__cxx11::string::string
                      ((string *)&local_50,
                       "Replacement scan should return either a table function or a subquery",
                       (allocator *)(local_a0 + 0xf));
            InternalException::InternalException(this_00,&local_50);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                   operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                               *)local_a0);
          pSVar6 = TableRef::Cast<duckdb::SubqueryRef>(pTVar4);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&(pSVar6->super_TableRef).column_name_alias,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)local_70._M_t.
                                super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>
                                .super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl + 0x50)
                     );
        }
        BVar2 = GetBindingMode((Binder *)this_02._M_head_impl);
        if (BVar2 == EXTRACT_REPLACEMENT_SCANS) {
          pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::
                   operator->((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                               *)local_a0);
          (*pTVar4->_vptr_TableRef[4])(&local_90,pTVar4);
          AddReplacementScan((Binder *)this_02._M_head_impl,local_80,
                             (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
                              *)&local_90);
          if ((element_type *)local_90._M_head_impl != (element_type *)0x0) {
            (*(code *)(((((enable_shared_from_this<duckdb::DatabaseInstance> *)
                         &(local_90._M_head_impl)->_vptr_TableRef)->__weak_this_).internal.
                        super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).
                      __weak_this_.internal.
                      super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
          local_90._M_head_impl = (TableRef *)0x0;
        }
        unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
                  ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
                   local_a0);
        Bind((Binder *)this_01._M_head_impl,(TableRef *)this_02._M_head_impl);
        if ((__uniq_ptr_data<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true,_true>)
            local_a0._0_8_ == (tuple<duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)0x0
           ) {
          return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                  )this_01._M_head_impl;
        }
        (**(code **)(*(long *)local_a0._0_8_ + 8))();
        return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>)
               this_01._M_head_impl;
      }
    }
  }
  ((BoundTableRef *)this)->_vptr_BoundTableRef = (_func_int **)0x0;
  return (unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>_>)
         (_Tuple_impl<0UL,_duckdb::BoundTableRef_*,_std::default_delete<duckdb::BoundTableRef>_>)
         this;
}

Assistant:

unique_ptr<BoundTableRef> Binder::BindWithReplacementScan(ClientContext &context, BaseTableRef &ref) {
	auto &config = DBConfig::GetConfig(context);
	if (!context.config.use_replacement_scans) {
		return nullptr;
	}
	for (auto &scan : config.replacement_scans) {
		ReplacementScanInput input(ref.catalog_name, ref.schema_name, ref.table_name);
		auto replacement_function = scan.function(context, input, scan.data.get());
		if (!replacement_function) {
			continue;
		}
		if (!ref.alias.empty()) {
			// user-provided alias overrides the default alias
			replacement_function->alias = ref.alias;
		} else if (replacement_function->alias.empty()) {
			// if the replacement scan itself did not provide an alias we use the table name
			replacement_function->alias = ref.table_name;
		}
		if (replacement_function->type == TableReferenceType::TABLE_FUNCTION) {
			auto &table_function = replacement_function->Cast<TableFunctionRef>();
			table_function.column_name_alias = ref.column_name_alias;
		} else if (replacement_function->type == TableReferenceType::SUBQUERY) {
			auto &subquery = replacement_function->Cast<SubqueryRef>();
			subquery.column_name_alias = ref.column_name_alias;
		} else {
			throw InternalException("Replacement scan should return either a table function or a subquery");
		}
		if (GetBindingMode() == BindingMode::EXTRACT_REPLACEMENT_SCANS) {
			AddReplacementScan(ref.table_name, replacement_function->Copy());
		}
		return Bind(*replacement_function);
	}
	return nullptr;
}